

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

int CountChunks(WebPChunk *chunk_list,uint32_t tag)

{
  WebPChunk *current;
  int count;
  uint32_t tag_local;
  WebPChunk *chunk_list_local;
  
  count = 0;
  for (current = chunk_list; current != (WebPChunk *)0x0; current = current->next_) {
    if ((tag == 0) || (current->tag_ == tag)) {
      count = count + 1;
    }
  }
  return count;
}

Assistant:

static int CountChunks(const WebPChunk* const chunk_list, uint32_t tag) {
  int count = 0;
  const WebPChunk* current;
  for (current = chunk_list; current != NULL; current = current->next_) {
    if (tag == NIL_TAG || current->tag_ == tag) {
      count++;  // Count chunks whose tags match.
    }
  }
  return count;
}